

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5MultiIterDoCompare(Fts5Iter *pIter,int iOut)

{
  Fts5CResult *pFVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  pFVar1 = pIter->aFirst;
  uVar9 = (ulong)(uint)iOut;
  iVar5 = pIter->nSeg / 2;
  iVar4 = iOut - iVar5;
  if (iOut < iVar5) {
    uVar8 = (uint)pFVar1[(uint)(iOut * 2)].iFirst;
    uVar6 = (uint)pFVar1[uVar9 * 2 + 1].iFirst;
  }
  else {
    uVar8 = iVar4 * 2;
    uVar6 = iVar4 * 2 + 1;
  }
  pFVar1[uVar9].bTermEq = '\0';
  uVar7 = uVar6;
  if ((pIter->aSeg[(int)uVar8].pLeaf != (Fts5Data *)0x0) &&
     (uVar7 = uVar8, pIter->aSeg[(int)uVar6].pLeaf != (Fts5Data *)0x0)) {
    iVar4 = fts5BufferCompare(&pIter->aSeg[(int)uVar8].term,&pIter->aSeg[(int)uVar6].term);
    if (iVar4 == 0) {
      pFVar1[uVar9].bTermEq = '\x01';
      lVar2 = pIter->aSeg[(int)uVar6].iRowid;
      lVar3 = pIter->aSeg[(int)uVar8].iRowid;
      if (lVar3 == lVar2) {
        pIter->aSeg[(int)uVar8].bDel = pIter->aSeg[(int)uVar6].bDel;
        return uVar6;
      }
      iVar4 = (uint)(pIter->bRev != (uint)(lVar2 < lVar3)) * 2 + -1;
    }
    uVar7 = uVar6;
    if (iVar4 < 0) {
      uVar7 = uVar8;
    }
  }
  pFVar1[uVar9].iFirst = (u16)uVar7;
  return 0;
}

Assistant:

static int fts5MultiIterDoCompare(Fts5Iter *pIter, int iOut){
  int i1;                         /* Index of left-hand Fts5SegIter */
  int i2;                         /* Index of right-hand Fts5SegIter */
  int iRes;
  Fts5SegIter *p1;                /* Left-hand Fts5SegIter */
  Fts5SegIter *p2;                /* Right-hand Fts5SegIter */
  Fts5CResult *pRes = &pIter->aFirst[iOut];

  assert( iOut<pIter->nSeg && iOut>0 );
  assert( pIter->bRev==0 || pIter->bRev==1 );

  if( iOut>=(pIter->nSeg/2) ){
    i1 = (iOut - pIter->nSeg/2) * 2;
    i2 = i1 + 1;
  }else{
    i1 = pIter->aFirst[iOut*2].iFirst;
    i2 = pIter->aFirst[iOut*2+1].iFirst;
  }
  p1 = &pIter->aSeg[i1];
  p2 = &pIter->aSeg[i2];

  pRes->bTermEq = 0;
  if( p1->pLeaf==0 ){           /* If p1 is at EOF */
    iRes = i2;
  }else if( p2->pLeaf==0 ){     /* If p2 is at EOF */
    iRes = i1;
  }else{
    int res = fts5BufferCompare(&p1->term, &p2->term);
    if( res==0 ){
      assert_nc( i2>i1 );
      assert_nc( i2!=0 );
      pRes->bTermEq = 1;
      if( p1->iRowid==p2->iRowid ){
        p1->bDel = p2->bDel;
        return i2;
      }
      res = ((p1->iRowid > p2->iRowid)==pIter->bRev) ? -1 : +1;
    }
    assert( res!=0 );
    if( res<0 ){
      iRes = i1;
    }else{
      iRes = i2;
    }
  }

  pRes->iFirst = (u16)iRes;
  return 0;
}